

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall libchars::edit_object::insert(edit_object *this,char c)

{
  char *p;
  char c_local;
  edit_object *this_local;
  
  if (this->buflen < 0x3fff) {
    if (this->insert_idx < this->buflen) {
      memmove(this->buffer + this->insert_idx + 1,this->buffer + this->insert_idx,
              this->buflen - this->insert_idx);
    }
    this->buffer[this->insert_idx] = c;
    this->insert_idx = this->insert_idx + 1;
    this->buflen = this->buflen + 1;
  }
  return;
}

Assistant:

virtual void insert(const char c)
        {
            if (buflen < (MAX_LINE-1)) {
                if (insert_idx < buflen) {
                    memmove(buffer+insert_idx+1, buffer+insert_idx, buflen-insert_idx);
                }
                volatile char *p = buffer + insert_idx;
                *p = c;
                ++insert_idx;
                ++buflen;
            }
        }